

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

pair<int,_std::array<int,_3UL>_> __thiscall
QPDF::processXRefW(QPDF *this,QPDFObjectHandle *dict,
                  function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *damaged
                  )

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  QPDFExc *pQVar7;
  long lVar8;
  int *piVar9;
  pair<int,_std::array<int,_3UL>_> pVar10;
  QPDFObjectHandle W_obj;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> w_vector;
  array<int,_3UL> W;
  QPDFObjectHandle local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  undefined1 local_80 [32];
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  int local_2c;
  undefined8 local_28;
  
  local_80._0_8_ = (pointer)(local_80 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"/W","");
  QPDFObjectHandle::getKey(&local_a0,(string *)dict);
  if ((pointer)local_80._0_8_ != (pointer)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_,
                    (ulong)((long)&(((BaseHandle *)local_80._16_8_)->obj).
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           + 1));
  }
  bVar3 = QPDFObjectHandle::isArray(&local_a0);
  if (bVar3) {
    iVar5 = QPDFObjectHandle::getArrayNItems(&local_a0);
    if (iVar5 < 3) goto LAB_0022c573;
    QPDFObjectHandle::getArrayItem(&local_40,(int)&local_a0);
    bVar3 = QPDFObjectHandle::isInteger(&local_40);
    if (!bVar3) {
      bVar3 = true;
      goto LAB_0022c576;
    }
    QPDFObjectHandle::getArrayItem(&local_50,(int)&local_a0);
    bVar3 = QPDFObjectHandle::isInteger(&local_50);
    if (bVar3) {
      QPDFObjectHandle::getArrayItem(&local_60,(int)&local_a0);
      bVar4 = QPDFObjectHandle::isInteger(&local_60);
      bVar3 = true;
      bVar2 = true;
      bVar1 = true;
      goto LAB_0022c57d;
    }
    bVar3 = true;
    bVar2 = true;
  }
  else {
LAB_0022c573:
    bVar3 = false;
LAB_0022c576:
    bVar2 = false;
  }
  bVar1 = false;
  bVar4 = false;
LAB_0022c57d:
  if ((bVar1) &&
     (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((bVar2) &&
     (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((bVar3) &&
     (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (bVar4 == false) {
    pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
    local_80._0_8_ = (pointer)0x34;
    local_80._8_8_ = "Cross-reference stream does not have a proper /W key";
    if ((damaged->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*damaged->_M_invoker)
              (pQVar7,(_Any_data *)damaged,
               (basic_string_view<char,_std::char_traits<char>_> *)local_80);
    __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  QPDFObjectHandle::getArrayAsVector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_80,&local_a0);
  lVar8 = 0;
  piVar9 = &local_2c;
  iVar5 = 0;
  do {
    iVar6 = QPDFObjectHandle::getIntValueAsInt
                      ((QPDFObjectHandle *)
                       ((long)&(((BaseHandle *)local_80._0_8_)->obj).
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                       lVar8));
    *piVar9 = iVar6;
    if (8 < iVar6) {
      pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_90._M_len = 0x3c;
      local_90._M_str = "Cross-reference stream\'s /W contains impossibly large values";
      if ((damaged->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*damaged->_M_invoker)(pQVar7,(_Any_data *)damaged,&local_90);
LAB_0022c6de:
      __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    if (iVar6 < 0) {
      pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_90._M_len = 0x34;
      local_90._M_str = "Cross-reference stream\'s /W contains negative values";
      if ((damaged->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*damaged->_M_invoker)(pQVar7,(_Any_data *)damaged,&local_90);
      goto LAB_0022c6de;
    }
    iVar5 = iVar5 + iVar6;
    lVar8 = lVar8 + 0x10;
    piVar9 = piVar9 + 1;
    if (lVar8 == 0x30) {
      if (iVar5 != 0) {
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_80);
        if (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        pVar10.second._M_elems[0] = local_2c;
        pVar10.first = iVar5;
        pVar10.second._M_elems[1] = (undefined4)local_28;
        pVar10.second._M_elems[2] = local_28._4_4_;
        return pVar10;
      }
      pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_90._M_len = 0x35;
      local_90._M_str = "Cross-reference stream\'s /W indicates entry size of 0";
      if ((damaged->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*damaged->_M_invoker)(pQVar7,(_Any_data *)damaged,&local_90);
      __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
  } while( true );
}

Assistant:

std::pair<int, std::array<int, 3>>
QPDF::processXRefW(QPDFObjectHandle& dict, std::function<QPDFExc(std::string_view)> damaged)
{
    auto W_obj = dict.getKey("/W");
    if (!(W_obj.isArray() && (W_obj.getArrayNItems() >= 3) && W_obj.getArrayItem(0).isInteger() &&
          W_obj.getArrayItem(1).isInteger() && W_obj.getArrayItem(2).isInteger())) {
        throw damaged("Cross-reference stream does not have a proper /W key");
    }

    std::array<int, 3> W;
    int entry_size = 0;
    auto w_vector = W_obj.getArrayAsVector();
    int max_bytes = sizeof(qpdf_offset_t);
    for (size_t i = 0; i < 3; ++i) {
        W[i] = w_vector[i].getIntValueAsInt();
        if (W[i] > max_bytes) {
            throw damaged("Cross-reference stream's /W contains impossibly large values");
        }
        if (W[i] < 0) {
            throw damaged("Cross-reference stream's /W contains negative values");
        }
        entry_size += W[i];
    }
    if (entry_size == 0) {
        throw damaged("Cross-reference stream's /W indicates entry size of 0");
    }
    return {entry_size, W};
}